

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O0

void __thiscall
btSimpleBroadphase::calculateOverlappingPairs(btSimpleBroadphase *this,btDispatcher *dispatcher)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  btBroadphasePair *a;
  undefined8 in_RSI;
  btSimpleBroadphase *in_RDI;
  bool hasOverlap;
  bool needsRemoval;
  bool isDuplicate;
  btBroadphasePair *pair;
  btBroadphasePair previousPair;
  btBroadphasePairArray *overlappingPairArray;
  btSimpleBroadphaseProxy *p1;
  btSimpleBroadphaseProxy *p0;
  btSimpleBroadphaseProxy *proxy1;
  btSimpleBroadphaseProxy *proxy0;
  int new_largest_index;
  int j;
  int i;
  btBroadphasePairSortPredicate *in_stack_ffffffffffffff28;
  btAlignedObjectArray<btBroadphasePair> *CompareFunc;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  btSimpleBroadphase *in_stack_ffffffffffffff40;
  btBroadphasePair *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff5c;
  undefined5 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  btBroadphasePair local_90;
  btBroadphasePair local_70;
  btAlignedObjectArray<btBroadphasePair> *local_48;
  btSimpleBroadphaseProxy *local_40;
  btSimpleBroadphaseProxy *local_38;
  btBroadphaseProxy *local_30;
  btBroadphaseProxy *local_28;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 local_10;
  
  if (-1 < in_RDI->m_numHandles) {
    local_1c = -1;
    local_10 = in_RSI;
    for (local_14 = 0; local_14 <= in_RDI->m_LastHandleIndex; local_14 = local_14 + 1) {
      local_28 = &in_RDI->m_pHandles[local_14].super_btBroadphaseProxy;
      if (((btBroadphaseProxy *)&local_28->m_clientObject)->m_clientObject != (void *)0x0) {
        local_1c = local_14;
        local_18 = local_14;
        while (local_18 = local_18 + 1, local_18 <= in_RDI->m_LastHandleIndex) {
          local_30 = &in_RDI->m_pHandles[local_18].super_btBroadphaseProxy;
          if (((btBroadphaseProxy *)&local_30->m_clientObject)->m_clientObject != (void *)0x0) {
            local_38 = getSimpleProxyFromProxy(in_RDI,local_28);
            local_40 = getSimpleProxyFromProxy(in_RDI,local_30);
            bVar2 = aabbOverlap((btSimpleBroadphaseProxy *)in_stack_ffffffffffffff40,
                                (btSimpleBroadphaseProxy *)in_RDI);
            if (bVar2) {
              iVar4 = (*(in_RDI->m_pairCache->super_btOverlappingPairCallback).
                        _vptr_btOverlappingPairCallback[0xd])(in_RDI->m_pairCache,local_28,local_30)
              ;
              if (CONCAT44(extraout_var,iVar4) == 0) {
                (*(in_RDI->m_pairCache->super_btOverlappingPairCallback).
                  _vptr_btOverlappingPairCallback[2])(in_RDI->m_pairCache,local_28,local_30);
              }
            }
            else {
              uVar3 = (*(in_RDI->m_pairCache->super_btOverlappingPairCallback).
                        _vptr_btOverlappingPairCallback[0xe])();
              if (((uVar3 & 1) == 0) &&
                 (iVar4 = (*(in_RDI->m_pairCache->super_btOverlappingPairCallback).
                            _vptr_btOverlappingPairCallback[0xd])
                                    (in_RDI->m_pairCache,local_28,local_30),
                 CONCAT44(extraout_var_00,iVar4) != 0)) {
                (*(in_RDI->m_pairCache->super_btOverlappingPairCallback).
                  _vptr_btOverlappingPairCallback[3])
                          (in_RDI->m_pairCache,local_28,local_30,local_10);
              }
            }
          }
        }
      }
    }
    in_RDI->m_LastHandleIndex = local_1c;
    if (((in_RDI->m_ownsPairCache & 1U) != 0) &&
       (uVar3 = (*(in_RDI->m_pairCache->super_btOverlappingPairCallback).
                  _vptr_btOverlappingPairCallback[0xe])(), (uVar3 & 1) != 0)) {
      iVar4 = (*(in_RDI->m_pairCache->super_btOverlappingPairCallback).
                _vptr_btOverlappingPairCallback[7])();
      local_48 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var_01,iVar4);
      btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
                ((btAlignedObjectArray<btBroadphasePair> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      CompareFunc = local_48;
      iVar4 = btAlignedObjectArray<btBroadphasePair>::size(local_48);
      iVar4 = iVar4 - in_RDI->m_invalidPair;
      btBroadphasePair::btBroadphasePair(&local_70);
      btAlignedObjectArray<btBroadphasePair>::resize
                ((btAlignedObjectArray<btBroadphasePair> *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,
                                   CONCAT15(in_stack_ffffffffffffff65,in_stack_ffffffffffffff60))),
                 in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
      in_RDI->m_invalidPair = 0;
      btBroadphasePair::btBroadphasePair(&local_90);
      local_90.m_pProxy0 = (btBroadphaseProxy *)0x0;
      local_90.m_pProxy1 = (btBroadphaseProxy *)0x0;
      local_90.m_algorithm = (btCollisionAlgorithm *)0x0;
      for (local_14 = 0; iVar1 = local_14,
          iVar5 = btAlignedObjectArray<btBroadphasePair>::size(local_48), iVar1 < iVar5;
          local_14 = local_14 + 1) {
        a = btAlignedObjectArray<btBroadphasePair>::operator[](local_48,local_14);
        in_stack_ffffffffffffff67 = operator==(a,&local_90);
        local_90.m_pProxy0 = a->m_pProxy0;
        local_90.m_pProxy1 = a->m_pProxy1;
        local_90.m_algorithm = a->m_algorithm;
        local_90.field_3 = a->field_3;
        if ((bool)in_stack_ffffffffffffff67) {
          in_stack_ffffffffffffff66 = true;
        }
        else {
          in_stack_ffffffffffffff65 =
               testAabbOverlap(in_stack_ffffffffffffff40,(btBroadphaseProxy *)in_RDI,
                               (btBroadphaseProxy *)CONCAT44(iVar4,in_stack_ffffffffffffff30));
          in_stack_ffffffffffffff66 = !(bool)in_stack_ffffffffffffff65;
        }
        if ((bool)in_stack_ffffffffffffff66 != false) {
          (*(in_RDI->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [8])(in_RDI->m_pairCache,a,local_10);
          a->m_pProxy0 = (btBroadphaseProxy *)0x0;
          a->m_pProxy1 = (btBroadphaseProxy *)0x0;
          in_RDI->m_invalidPair = in_RDI->m_invalidPair + 1;
          gOverlappingPairs = gOverlappingPairs + -1;
        }
      }
      btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
                ((btAlignedObjectArray<btBroadphasePair> *)CONCAT44(iVar4,in_stack_ffffffffffffff30)
                 ,(btBroadphasePairSortPredicate *)CompareFunc);
      btAlignedObjectArray<btBroadphasePair>::size(local_48);
      btBroadphasePair::btBroadphasePair((btBroadphasePair *)&stack0xffffffffffffff40);
      btAlignedObjectArray<btBroadphasePair>::resize
                ((btAlignedObjectArray<btBroadphasePair> *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,
                                   CONCAT15(in_stack_ffffffffffffff65,in_stack_ffffffffffffff60))),
                 in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
      in_RDI->m_invalidPair = 0;
    }
  }
  return;
}

Assistant:

void	btSimpleBroadphase::calculateOverlappingPairs(btDispatcher* dispatcher)
{
	//first check for new overlapping pairs
	int i,j;
	if (m_numHandles >= 0)
	{
		int new_largest_index = -1;
		for (i=0; i <= m_LastHandleIndex; i++)
		{
			btSimpleBroadphaseProxy* proxy0 = &m_pHandles[i];
			if(!proxy0->m_clientObject)
			{
				continue;
			}
			new_largest_index = i;
			for (j=i+1; j <= m_LastHandleIndex; j++)
			{
				btSimpleBroadphaseProxy* proxy1 = &m_pHandles[j];
				btAssert(proxy0 != proxy1);
				if(!proxy1->m_clientObject)
				{
					continue;
				}

				btSimpleBroadphaseProxy* p0 = getSimpleProxyFromProxy(proxy0);
				btSimpleBroadphaseProxy* p1 = getSimpleProxyFromProxy(proxy1);

				if (aabbOverlap(p0,p1))
				{
					if ( !m_pairCache->findPair(proxy0,proxy1))
					{
						m_pairCache->addOverlappingPair(proxy0,proxy1);
					}
				} else
				{
					if (!m_pairCache->hasDeferredRemoval())
					{
						if ( m_pairCache->findPair(proxy0,proxy1))
						{
							m_pairCache->removeOverlappingPair(proxy0,proxy1,dispatcher);
						}
					}
				}
			}
		}

		m_LastHandleIndex = new_largest_index;

		if (m_ownsPairCache && m_pairCache->hasDeferredRemoval())
		{

			btBroadphasePairArray&	overlappingPairArray = m_pairCache->getOverlappingPairArray();

			//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
			overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

			overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
			m_invalidPair = 0;


			btBroadphasePair previousPair;
			previousPair.m_pProxy0 = 0;
			previousPair.m_pProxy1 = 0;
			previousPair.m_algorithm = 0;


			for (i=0;i<overlappingPairArray.size();i++)
			{

				btBroadphasePair& pair = overlappingPairArray[i];

				bool isDuplicate = (pair == previousPair);

				previousPair = pair;

				bool needsRemoval = false;

				if (!isDuplicate)
				{
					bool hasOverlap = testAabbOverlap(pair.m_pProxy0,pair.m_pProxy1);

					if (hasOverlap)
					{
						needsRemoval = false;//callback->processOverlap(pair);
					} else
					{
						needsRemoval = true;
					}
				} else
				{
					//remove duplicate
					needsRemoval = true;
					//should have no algorithm
					btAssert(!pair.m_algorithm);
				}

				if (needsRemoval)
				{
					m_pairCache->cleanOverlappingPair(pair,dispatcher);

					//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
					//		m_overlappingPairArray.pop_back();
					pair.m_pProxy0 = 0;
					pair.m_pProxy1 = 0;
					m_invalidPair++;
					gOverlappingPairs--;
				} 

			}

			///if you don't like to skip the invalid pairs in the array, execute following code:
#define CLEAN_INVALID_PAIRS 1
#ifdef CLEAN_INVALID_PAIRS

			//perform a sort, to sort 'invalid' pairs to the end
			overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

			overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
			m_invalidPair = 0;
#endif//CLEAN_INVALID_PAIRS

		}
	}
}